

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O3

int pool_bulk_lookup(StringPool *pool,xmlHashTablePtr hash,size_t num,int existing)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  xmlChar *pxVar5;
  char *pcVar6;
  undefined8 uVar7;
  xmlChar *pxVar8;
  ulong uVar9;
  long lVar10;
  xmlChar **ppxVar11;
  xmlChar *prefix [3];
  xmlChar *local [3];
  undefined8 local_88 [4];
  size_t local_68;
  ulong local_60;
  ulong local_58;
  StringPool *local_50;
  undefined8 local_48 [3];
  
  local_58 = pool->index;
  iVar4 = 0;
  if (num != 0 && local_58 < pool->num_strings) {
    iVar4 = 0;
    local_60 = 0;
    local_68 = num;
    local_50 = pool;
    do {
      ppxVar11 = pool->strings + local_58;
      bVar3 = true;
      do {
        bVar2 = bVar3;
        uVar1 = pool->num_keys;
        if (bVar2) {
          if (uVar1 == 3) {
            pxVar5 = (xmlChar *)xmlHashLookup3(hash,*ppxVar11,ppxVar11[1]);
          }
          else if (uVar1 == 2) {
            pxVar5 = (xmlChar *)xmlHashLookup2(hash,*ppxVar11,ppxVar11[1]);
          }
          else if (uVar1 == 1) {
            pxVar5 = (xmlChar *)xmlHashLookup(hash,*ppxVar11);
          }
          else {
            pxVar5 = (xmlChar *)0x0;
          }
        }
        else {
          uVar9 = 0;
          do {
            if (uVar9 < uVar1) {
              pxVar5 = ppxVar11[uVar9];
              pcVar6 = strchr((char *)pxVar5,0x3a);
              if (pcVar6 == (char *)0x0) {
                local_88[uVar9] = 0;
              }
              else {
                uVar7 = xmlStrndup(pxVar5,(int)pcVar6 - (int)pxVar5);
                local_88[uVar9] = uVar7;
                pxVar5 = (xmlChar *)(pcVar6 + 1);
              }
            }
            else {
              local_88[uVar9] = 0;
              pxVar5 = (xmlChar *)0x0;
            }
            local_48[uVar9] = pxVar5;
            uVar9 = uVar9 + 1;
          } while (uVar9 != 3);
          pxVar5 = (xmlChar *)
                   xmlHashQLookup3(hash,local_88[0],local_48[0],local_88[1],local_48[1],local_88[2],
                                   local_48[2]);
          lVar10 = 0;
          do {
            (*_xmlFree)(local_88[lVar10]);
            lVar10 = lVar10 + 1;
            pool = local_50;
          } while (lVar10 != 3);
        }
        if (existing == 0) {
          pxVar8 = (xmlChar *)0x0;
        }
        else {
          pxVar8 = *ppxVar11;
        }
        if (pxVar5 != pxVar8) {
          iVar4 = -1;
        }
        bVar3 = false;
      } while (bVar2);
      local_58 = local_58 + pool->num_keys;
    } while ((local_58 < pool->num_strings) && (local_60 = local_60 + 1, local_60 < local_68));
  }
  pool->index = local_58;
  return iVar4;
}

Assistant:

static int
pool_bulk_lookup(StringPool *pool, xmlHashTablePtr hash, size_t num,
                 int existing) {
    size_t i, j;
    int ret = 0;

    for (i = pool->index, j = 0; i < pool->num_strings && j < num; j++) {
        xmlChar **str = &pool->strings[i];
        int q;

        for (q = 0; q < 2; q++) {
            xmlChar *res = NULL;

            if (q) {
                res = hash_qlookup(hash, str, pool->num_keys);
            } else {
                switch (pool->num_keys) {
                    case 1:
                        res = xmlHashLookup(hash, str[0]);
                        break;
                    case 2:
                        res = xmlHashLookup2(hash, str[0], str[1]);
                        break;
                    case 3:
                        res = xmlHashLookup3(hash, str[0], str[1], str[2]);
                        break;
                }
            }

            if (existing) {
                if (res != str[0])
                    ret = -1;
            } else {
                if (res != NULL)
                    ret = -1;
            }
        }

        i += pool->num_keys;
    }

    pool->index = i;
    return ret;
}